

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

EllSwiftPubKey * __thiscall CKey::EllSwiftCreate(CKey *this,Span<const_std::byte> ent32)

{
  long lVar1;
  Span<const_std::byte> ellswift;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  array<std::byte,_64UL> *other;
  Span<const_std::byte> *this_00;
  undefined8 in_RSI;
  EllSwiftPubKey *in_RDI;
  long in_FS_OFFSET;
  int success;
  array<std::byte,_64UL> encoded_pubkey;
  Span<const_std::byte> *in_stack_ffffffffffffff58;
  secp256k1_context *this_01;
  undefined4 in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      *)in_stack_ffffffffffffff58);
  if (!bVar2) {
    __assert_fail("keydata",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0x139,"EllSwiftPubKey CKey::EllSwiftCreate(Span<const std::byte>) const");
  }
  sVar4 = Span<const_std::byte>::size(in_stack_ffffffffffffff58);
  if (sVar4 != 0x20) {
    __assert_fail("ent32.size() == 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0x13a,"EllSwiftPubKey CKey::EllSwiftCreate(Span<const std::byte>) const");
  }
  this_01 = secp256k1_context_sign;
  std::array<std::byte,_64UL>::data((array<std::byte,_64UL> *)secp256k1_context_sign);
  other = (array<std::byte,_64UL> *)UCharCast((byte *)this_01);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::operator->((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                *)this_01);
  this_00 = (Span<const_std::byte> *)
            std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)this_01);
  Span<const_std::byte>::data((Span<const_std::byte> *)this_01);
  UCharCast((byte *)this_01);
  iVar3 = secp256k1_ellswift_create
                    ((secp256k1_context *)encoded_pubkey._M_elems._24_8_,
                     (uchar *)encoded_pubkey._M_elems._16_8_,(uchar *)encoded_pubkey._M_elems._8_8_,
                     (uchar *)encoded_pubkey._M_elems._0_8_);
  if (iVar3 == 0) {
    __assert_fail("success",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0x143,"EllSwiftPubKey CKey::EllSwiftCreate(Span<const std::byte>) const");
  }
  Span<std::byte_const>::Span<std::array<std::byte,64ul>>(this_00,other,this_01);
  ellswift.m_size._0_4_ = in_stack_ffffffffffffff88;
  ellswift.m_data = (byte *)in_RSI;
  ellswift.m_size._4_4_ = iVar3;
  EllSwiftPubKey::EllSwiftPubKey(in_RDI,ellswift);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

EllSwiftPubKey CKey::EllSwiftCreate(Span<const std::byte> ent32) const
{
    assert(keydata);
    assert(ent32.size() == 32);
    std::array<std::byte, EllSwiftPubKey::size()> encoded_pubkey;

    auto success = secp256k1_ellswift_create(secp256k1_context_sign,
                                             UCharCast(encoded_pubkey.data()),
                                             keydata->data(),
                                             UCharCast(ent32.data()));

    // Should always succeed for valid keys (asserted above).
    assert(success);
    return {encoded_pubkey};
}